

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch.h
# Opt level: O2

string * hashStr_abi_cxx11_(string *__return_storage_ptr__,uint32_t param_1)

{
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "    static inline constexpr uint32_t hash(uint32_t a) noexcept{\n",
             (allocator<char> *)&local_d0);
  if (c._M_elems[0] == 0) {
    if (c._M_elems[1] == 0) goto LAB_00105038;
    std::__cxx11::to_string(&local_b0,c._M_elems[1]);
    std::operator+(&local_90,"        a ^= a >> ",&local_b0);
    std::operator+(&local_d0,&local_90,";\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
LAB_0010501a:
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    this = &local_b0;
  }
  else {
    if (c._M_elems[1] == 0) {
      std::__cxx11::to_string(&local_b0,c._M_elems[0]);
      std::operator+(&local_90,"        a ^= a ^ ",&local_b0);
      std::operator+(&local_d0,&local_90,";\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      goto LAB_0010501a;
    }
    std::__cxx11::to_string(&local_50,c._M_elems[0]);
    std::operator+(&local_30,"        a =  (a ^ ",&local_50);
    std::operator+(&local_b0,&local_30,") ^ (a >> ");
    std::__cxx11::to_string(&local_70,c._M_elems[1]);
    std::operator+(&local_90,&local_b0,&local_70);
    std::operator+(&local_d0,&local_90,");\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_30);
    this = &local_50;
  }
  std::__cxx11::string::~string((string *)this);
LAB_00105038:
  if (c._M_elems[2] != 0) {
    std::__cxx11::to_string(&local_b0,c._M_elems[2]);
    std::operator+(&local_90,"        a += a << ",&local_b0);
    std::operator+(&local_d0,&local_90,";\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if (c._M_elems[3] != 0) {
    std::__cxx11::to_string(&local_b0,c._M_elems[3]);
    std::operator+(&local_90,"        a ^= a >> ",&local_b0);
    std::operator+(&local_d0,&local_90,";\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if (c._M_elems[4] != 0) {
    std::__cxx11::to_string(&local_b0,c._M_elems[4] + 1);
    std::operator+(&local_90,"        a *= ",&local_b0);
    std::operator+(&local_d0,&local_90,";\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if (c._M_elems[5] != 0) {
    std::__cxx11::to_string(&local_b0,c._M_elems[5]);
    std::operator+(&local_90,"        a ^= a >> ",&local_b0);
    std::operator+(&local_d0,&local_90,";\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string hashStr(uint32_t){
    std::string str =
"    static inline constexpr uint32_t hash(uint32_t a) noexcept{\n";
    if(c[0] && c[1])
        str += "        a =  (a ^ " + std::to_string(c[0]) + ") ^ (a >> " + std::to_string(c[1]) + ");\n";
    else if(c[0])
        str += "        a ^= a ^ " + std::to_string(c[0]) + ";\n";
    else if(c[1])
        str += "        a ^= a >> " + std::to_string(c[1]) + ";\n";

    if(c[2]) str += "        a += a << " + std::to_string(c[2]) + ";\n";
    if(c[3]) str += "        a ^= a >> " + std::to_string(c[3]) + ";\n";
    if(c[4]) str += "        a *= " + std::to_string(c[4]+1) + ";\n";
    if(c[5]) str += "        a ^= a >> " + std::to_string(c[5]) + ";\n";

    str += "        return a;\n"
           "    }\n";

    return str;
}